

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchSCHashTable.c
# Opt level: O2

int Fxch_SCHashTableRemove
              (Fxch_SCHashTable_t *pSCHashTable,Vec_Wec_t *vCubes,uint32_t SubCubeID,uint32_t iCube,
              uint32_t iLit0,uint32_t iLit1,char fUpdate)

{
  Fxch_SCHashTable_Entry_t *pFVar1;
  uint32_t uVar2;
  Fxch_SubCube_t *pFVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  Fxch_SubCube_t *pSCData0;
  int *piVar8;
  int *piVar9;
  Vec_Int_t *p;
  uint uVar10;
  undefined4 in_register_0000000c;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  Fxch_SubCube_t *pFVar16;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  int local_74;
  uint32_t BinID;
  uint32_t SubCubeID_local;
  
  SubCubeID_local = SubCubeID;
  MurmurHash3_x86_32(&SubCubeID_local,(int)&BinID,SubCubeID,
                     (void *)CONCAT44(in_register_0000000c,iCube));
  uVar10 = pSCHashTable->SizeMask & BinID;
  pFVar1 = pSCHashTable->pBins + uVar10;
  uVar10 = *(uint *)&pSCHashTable->pBins[uVar10].field_0x8;
  uVar11 = uVar10 & 0xffff;
  if ((ulong)uVar11 != 1) {
    lVar17 = 0;
    uVar14 = 0;
    do {
      if ((ulong)uVar11 * 0xc - lVar17 == 0) {
LAB_003fb89e:
        __assert_fail("( iEntry != (int)pBin->Size ) && ( pBin->Size != 0 )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/FxchSCHashTable.c"
                      ,300,
                      "int Fxch_SCHashTableRemove(Fxch_SCHashTable_t *, Vec_Wec_t *, uint32_t, uint32_t, uint32_t, uint32_t, char)"
                     );
      }
      if (*(uint32_t *)((long)&pFVar1->vSCData->iCube + lVar17) == iCube) {
        if ((uVar11 != 0) && (uVar11 * 0xc != (int)lVar17)) {
          pFVar3 = pFVar1->vSCData;
          pSCData0 = (Fxch_SubCube_t *)((long)&pFVar3->Id + lVar17);
          uVar13 = 0;
          local_74 = 0;
          goto LAB_003fb658;
        }
        goto LAB_003fb89e;
      }
      uVar14 = uVar14 + 1;
      lVar17 = lVar17 + 0xc;
    } while( true );
  }
  uVar10 = uVar10 & 0xffff0000;
  local_74 = 0;
LAB_003fb88a:
  *(uint *)&pFVar1->field_0x8 = uVar10;
  return local_74;
LAB_003fb658:
  if ((uVar10 & 0xffff) <= uVar13) goto LAB_003fb847;
  if (uVar14 != uVar13) {
    pFVar16 = pFVar1->vSCData;
    piVar8 = Vec_IntEntryP(pSCHashTable->pFxchMan->vOutputID,
                           pSCHashTable->pFxchMan->nSizeOutputID *
                           *(int *)((long)&pFVar3->iCube + lVar17));
    piVar9 = Vec_IntEntryP(pSCHashTable->pFxchMan->vOutputID,
                           pSCHashTable->pFxchMan->nSizeOutputID * pFVar16[uVar13].iCube);
    if (*(uint *)(&pFVar3->field_0x8 + lVar17) < 0x10000) {
      if (*(uint *)&pFVar16[uVar13].field_0x8 < 0x10000) {
LAB_003fb6e3:
        pFVar16 = pFVar16 + uVar13;
        iVar4 = Fxch_SCHashTableEntryCompare(pSCHashTable,vCubes,pSCData0,pFVar16);
        if ((((iVar4 != 0) && (*(short *)(&pFVar3->field_0x8 + lVar17) != 0)) &&
            (*(short *)&pFVar16->field_0x8 != 0)) &&
           (iVar4 = Fxch_DivCreate(pSCHashTable->pFxchMan,pFVar16,pSCData0), -1 < iVar4)) {
          uVar10 = pSCHashTable->pFxchMan->nSizeOutputID;
          uVar12 = 0;
          uVar18 = (ulong)uVar10;
          if ((int)uVar10 < 1) {
            uVar18 = uVar12;
          }
          iVar15 = 0;
          for (; uVar18 != uVar12; uVar12 = uVar12 + 1) {
            iVar5 = Fxch_CountOnes(piVar9[uVar12] & piVar8[uVar12]);
            iVar15 = iVar15 + iVar5;
          }
          iVar5 = -1;
          while( true ) {
            bVar19 = iVar15 == 0;
            iVar15 = iVar15 + -1;
            if (bVar19) break;
            iVar5 = Fxch_DivRemove(pSCHashTable->pFxchMan,(int)fUpdate,0,iVar4);
          }
          p = Vec_WecEntry(pSCHashTable->pFxchMan->vDivCubePairs,iVar5);
          for (iVar4 = 1; iVar4 < p->nSize; iVar4 = iVar4 + 2) {
            uVar6 = Vec_IntEntry(p,iVar4 + -1);
            uVar7 = Vec_IntEntry(p,iVar4);
            uVar2 = *(uint32_t *)((long)&pFVar3->iCube + lVar17);
            if (((uVar6 == pFVar16->iCube) && (uVar7 == uVar2)) ||
               ((uVar6 == uVar2 && (uVar7 == pFVar16->iCube)))) {
              Vec_IntDrop(p,iVar4);
              Vec_IntDrop(p,iVar4 + -1);
            }
          }
          if (p->nSize == 0) {
            Vec_IntErase(p);
          }
          local_74 = local_74 + 1;
        }
      }
    }
    else if (0xffff < *(uint *)&pFVar16[uVar13].field_0x8) goto LAB_003fb6e3;
  }
  uVar13 = uVar13 + 1;
  uVar10 = (uint)*(ushort *)&pFVar1->field_0x8;
  goto LAB_003fb658;
LAB_003fb847:
  memmove((void *)((long)&pFVar1->vSCData->Id + lVar17),
          (void *)((long)&pFVar1->vSCData[1].Id + lVar17),
          (long)(int)(~(uint)uVar14 + (uVar10 & 0xffff)) * 0xc);
  uVar10 = *(uint *)&pFVar1->field_0x8 & 0xffff0000 | *(uint *)&pFVar1->field_0x8 - 1 & 0xffff;
  goto LAB_003fb88a;
}

Assistant:

int Fxch_SCHashTableRemove( Fxch_SCHashTable_t* pSCHashTable,
                            Vec_Wec_t* vCubes,
                            uint32_t SubCubeID,
                            uint32_t iCube,
                            uint32_t iLit0,
                            uint32_t iLit1,
                            char fUpdate )
{
    int iEntry;
    int Pairs = 0;
    uint32_t BinID;
    Fxch_SCHashTable_Entry_t* pBin;
    Fxch_SubCube_t* pEntry;
    int idx;

    MurmurHash3_x86_32( ( void* ) &SubCubeID, sizeof( int ), 0x9747b28c, &BinID);

    pBin = Fxch_SCHashTableBin( pSCHashTable, BinID );

    if ( pBin->Size == 1 )
    {
        pBin->Size = 0;
        return 0;
    }

    for ( iEntry = 0; iEntry < (int)pBin->Size; iEntry++ )
        if ( pBin->vSCData[iEntry].iCube == iCube )
            break;

    assert( ( iEntry != (int)pBin->Size ) && ( pBin->Size != 0 ) );

    pEntry = &( pBin->vSCData[iEntry] );
    for ( idx = 0; idx < (int)pBin->Size; idx++ )
    if ( idx != iEntry )
    {
        int Base,
            iDiv = -1;

        int i, z,
            iCube0,
            iCube1;

        Fxch_SubCube_t* pNextEntry = &( pBin->vSCData[idx] );
        Vec_Int_t* vDivCubePairs;
        int* pOutputID0 = Vec_IntEntryP( pSCHashTable->pFxchMan->vOutputID, pEntry->iCube * pSCHashTable->pFxchMan->nSizeOutputID );
        int* pOutputID1 = Vec_IntEntryP( pSCHashTable->pFxchMan->vOutputID, pNextEntry->iCube * pSCHashTable->pFxchMan->nSizeOutputID );
        int Result = 0;

        if ( (pEntry->iLit1 != 0 && pNextEntry->iLit1 == 0) || (pEntry->iLit1 == 0 && pNextEntry->iLit1 != 0)  )
            continue;

        if ( !Fxch_SCHashTableEntryCompare( pSCHashTable, vCubes, pEntry, pNextEntry )
             || pEntry->iLit0 == 0
             || pNextEntry->iLit0 == 0 )
            continue;

        Base = Fxch_DivCreate( pSCHashTable->pFxchMan, pNextEntry, pEntry );

        if ( Base < 0 )
            continue;

        for ( i = 0; i < pSCHashTable->pFxchMan->nSizeOutputID; i++ )
            Result += Fxch_CountOnes( pOutputID0[i] & pOutputID1[i] );

        for ( z = 0; z < Result; z++ )
            iDiv = Fxch_DivRemove( pSCHashTable->pFxchMan, fUpdate, 0, Base );

        vDivCubePairs = Vec_WecEntry( pSCHashTable->pFxchMan->vDivCubePairs, iDiv );
        Vec_IntForEachEntryDouble( vDivCubePairs, iCube0, iCube1, i )
            if ( ( iCube0 == (int)pNextEntry->iCube && iCube1 == (int)pEntry->iCube )  ||
                 ( iCube0 == (int)pEntry->iCube && iCube1 == (int)pNextEntry->iCube ) )
            {
                Vec_IntDrop( vDivCubePairs, i+1 );
                Vec_IntDrop( vDivCubePairs, i );
            }
        if ( Vec_IntSize( vDivCubePairs ) == 0 )
            Vec_IntErase( vDivCubePairs );

        Pairs++;
    }

    memmove(pBin->vSCData + iEntry, pBin->vSCData + iEntry + 1, (pBin->Size - iEntry - 1) * sizeof(*pBin->vSCData));
    pBin->Size -= 1;

    return Pairs;
}